

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O0

void a__appProcessXKeyEvent(XEvent *e)

{
  ATimeUs AVar1;
  uint uVar2;
  long lVar3;
  AKey local_18;
  int down;
  AKey key;
  ATimeUs timestamp;
  XEvent *e_local;
  
  AVar1 = aAppTime();
  uVar2 = (uint)(e->type == 2);
  lVar3 = XLookupKeysym(e,0);
  if (lVar3 == 0x20) {
    local_18 = AK_Space;
  }
  else if (lVar3 == 0x2a) {
    local_18 = AK_KeypadAsterisk;
  }
  else if (lVar3 == 0x2c) {
    local_18 = AK_Comma;
  }
  else if (lVar3 == 0x2d) {
    local_18 = AK_Minus;
  }
  else if (lVar3 == 0x2e) {
    local_18 = AK_Dot;
  }
  else if (lVar3 == 0x2f) {
    local_18 = AK_Slash;
  }
  else if (lVar3 == 0x30) {
    local_18 = AK_0;
  }
  else if (lVar3 == 0x31) {
    local_18 = AK_1;
  }
  else if (lVar3 == 0x32) {
    local_18 = AK_2;
  }
  else if (lVar3 == 0x33) {
    local_18 = AK_3;
  }
  else if (lVar3 == 0x34) {
    local_18 = AK_4;
  }
  else if (lVar3 == 0x35) {
    local_18 = AK_5;
  }
  else if (lVar3 == 0x36) {
    local_18 = AK_6;
  }
  else if (lVar3 == 0x37) {
    local_18 = AK_7;
  }
  else if (lVar3 == 0x38) {
    local_18 = AK_8;
  }
  else if (lVar3 == 0x39) {
    local_18 = AK_9;
  }
  else if (lVar3 == 0x3d) {
    local_18 = AK_Equal;
  }
  else if (lVar3 == 0x61) {
    local_18 = AK_A;
  }
  else if (lVar3 == 0x62) {
    local_18 = AK_B;
  }
  else if (lVar3 == 99) {
    local_18 = AK_C;
  }
  else if (lVar3 == 100) {
    local_18 = AK_D;
  }
  else if (lVar3 == 0x65) {
    local_18 = AK_E;
  }
  else if (lVar3 == 0x66) {
    local_18 = AK_F;
  }
  else if (lVar3 == 0x67) {
    local_18 = AK_G;
  }
  else if (lVar3 == 0x68) {
    local_18 = AK_H;
  }
  else if (lVar3 == 0x69) {
    local_18 = AK_I;
  }
  else if (lVar3 == 0x6a) {
    local_18 = AK_J;
  }
  else if (lVar3 == 0x6b) {
    local_18 = AK_K;
  }
  else if (lVar3 == 0x6c) {
    local_18 = AK_L;
  }
  else if (lVar3 == 0x6d) {
    local_18 = AK_M;
  }
  else if (lVar3 == 0x6e) {
    local_18 = AK_N;
  }
  else if (lVar3 == 0x6f) {
    local_18 = AK_O;
  }
  else if (lVar3 == 0x70) {
    local_18 = AK_P;
  }
  else if (lVar3 == 0x71) {
    local_18 = AK_Q;
  }
  else if (lVar3 == 0x72) {
    local_18 = AK_R;
  }
  else if (lVar3 == 0x73) {
    local_18 = AK_S;
  }
  else if (lVar3 == 0x74) {
    local_18 = AK_T;
  }
  else if (lVar3 == 0x75) {
    local_18 = AK_U;
  }
  else if (lVar3 == 0x76) {
    local_18 = AK_V;
  }
  else if (lVar3 == 0x77) {
    local_18 = AK_W;
  }
  else if (lVar3 == 0x78) {
    local_18 = AK_X;
  }
  else if (lVar3 == 0x79) {
    local_18 = AK_Y;
  }
  else if (lVar3 == 0x7a) {
    local_18 = AK_Z;
  }
  else if (lVar3 == 0xff08) {
    local_18 = AK_Backspace;
  }
  else if (lVar3 == 0xff09) {
    local_18 = AK_Tab;
  }
  else if (lVar3 == 0xff0d) {
    local_18 = AK_Enter;
  }
  else if (lVar3 == 0xff1b) {
    local_18 = AK_Esc;
  }
  else if (lVar3 == 0xff50) {
    local_18 = AK_Home;
  }
  else if (lVar3 == 0xff51) {
    local_18 = AK_Left;
  }
  else if (lVar3 == 0xff52) {
    local_18 = AK_Up;
  }
  else if (lVar3 == 0xff53) {
    local_18 = AK_Right;
  }
  else if (lVar3 == 0xff54) {
    local_18 = AK_Down;
  }
  else if (lVar3 == 0xff55) {
    local_18 = AK_PageUp;
  }
  else if (lVar3 == 0xff56) {
    local_18 = AK_PageDown;
  }
  else if (lVar3 == 0xff57) {
    local_18 = AK_End;
  }
  else if (lVar3 == 0xff63) {
    local_18 = AK_Ins;
  }
  else if (lVar3 == 0xffab) {
    local_18 = AK_KeypadPlus;
  }
  else if (lVar3 == 0xffad) {
    local_18 = AK_KeypadMinus;
  }
  else if (lVar3 == 0xffbe) {
    local_18 = AK_F1;
  }
  else if (lVar3 == 0xffbf) {
    local_18 = AK_F2;
  }
  else if (lVar3 == 0xffc0) {
    local_18 = AK_F3;
  }
  else if (lVar3 == 0xffc1) {
    local_18 = AK_F4;
  }
  else if (lVar3 == 0xffc2) {
    local_18 = AK_F5;
  }
  else if (lVar3 == 0xffc3) {
    local_18 = AK_F6;
  }
  else if (lVar3 == 0xffc4) {
    local_18 = AK_F7;
  }
  else if (lVar3 == 0xffc5) {
    local_18 = AK_F8;
  }
  else if (lVar3 == 0xffc6) {
    local_18 = AK_F9;
  }
  else if (lVar3 == 0xffc7) {
    local_18 = AK_F10;
  }
  else if (lVar3 == 0xffc8) {
    local_18 = AK_F11;
  }
  else if (lVar3 == 0xffc9) {
    local_18 = AK_F12;
  }
  else if (lVar3 == 0xffe1) {
    local_18 = AK_LeftShift;
  }
  else if (lVar3 == 0xffe2) {
    local_18 = AK_RightShift;
  }
  else if (lVar3 == 0xffe3) {
    local_18 = AK_LeftCtrl;
  }
  else if (lVar3 == 0xffe4) {
    local_18 = AK_RightCtrl;
  }
  else if (lVar3 == 0xffe5) {
    local_18 = AK_Capslock;
  }
  else if (lVar3 == 0xffe7) {
    local_18 = AK_LeftMeta;
  }
  else if (lVar3 == 0xffe8) {
    local_18 = AK_RightMeta;
  }
  else if (lVar3 == 0xffe9) {
    local_18 = AK_LeftAlt;
  }
  else if (lVar3 == 0xffea) {
    local_18 = AK_RightAlt;
  }
  else if (lVar3 == 0xffeb) {
    local_18 = AK_LeftSuper;
  }
  else if (lVar3 == 0xffec) {
    local_18 = AK_RightSuper;
  }
  else {
    if (lVar3 != 0xffff) {
      return;
    }
    local_18 = AK_Del;
  }
  if ((a__app_state.keys[local_18] != uVar2) &&
     (a__app_state.keys[local_18] = uVar2,
     a__app_proctable.key != (_func_void_ATimeUs_AKey_int *)0x0)) {
    (*a__app_proctable.key)(AVar1,local_18,uVar2);
  }
  return;
}

Assistant:

static void a__appProcessXKeyEvent(XEvent *e) {
	ATimeUs timestamp = aAppTime();
	AKey key = AK_Unknown;
	int down = KeyPress == e->type;
	switch (XLookupKeysym(&e->xkey, 0)) {
#define ATTOMAPK__(x, a) \
	case XK_##x: key = AK_##a; break;
		ATTOMAPK__(BackSpace, Backspace)
		ATTOMAPK__(Tab, Tab)
		ATTOMAPK__(Return, Enter)
		ATTOMAPK__(space, Space)
		ATTOMAPK__(Escape, Esc)
		ATTOMAPK__(Page_Up, PageUp)
		ATTOMAPK__(Page_Down, PageDown)
		ATTOMAPK__(Left, Left)
		ATTOMAPK__(Up, Up)
		ATTOMAPK__(Right, Right)
		ATTOMAPK__(Down, Down)
		ATTOMAPK__(comma, Comma)
		ATTOMAPK__(minus, Minus)
		ATTOMAPK__(period, Dot)
		ATTOMAPK__(slash, Slash)
		ATTOMAPK__(equal, Equal)
		ATTOMAPK__(Delete, Del)
		ATTOMAPK__(Insert, Ins)
		ATTOMAPK__(Home, Home)
		ATTOMAPK__(End, End)
		ATTOMAPK__(asterisk, KeypadAsterisk)
		ATTOMAPK__(0, 0)
		ATTOMAPK__(1, 1)
		ATTOMAPK__(2, 2)
		ATTOMAPK__(3, 3)
		ATTOMAPK__(4, 4)
		ATTOMAPK__(5, 5)
		ATTOMAPK__(6, 6)
		ATTOMAPK__(7, 7)
		ATTOMAPK__(8, 8)
		ATTOMAPK__(9, 9)
		ATTOMAPK__(a, A)
		ATTOMAPK__(b, B)
		ATTOMAPK__(c, C)
		ATTOMAPK__(d, D)
		ATTOMAPK__(e, E)
		ATTOMAPK__(f, F)
		ATTOMAPK__(g, G)
		ATTOMAPK__(h, H)
		ATTOMAPK__(i, I)
		ATTOMAPK__(j, J)
		ATTOMAPK__(k, K)
		ATTOMAPK__(l, L)
		ATTOMAPK__(m, M)
		ATTOMAPK__(n, N)
		ATTOMAPK__(o, O)
		ATTOMAPK__(p, P)
		ATTOMAPK__(q, Q)
		ATTOMAPK__(r, R)
		ATTOMAPK__(s, S)
		ATTOMAPK__(t, T)
		ATTOMAPK__(u, U)
		ATTOMAPK__(v, V)
		ATTOMAPK__(w, W)
		ATTOMAPK__(x, X)
		ATTOMAPK__(y, Y)
		ATTOMAPK__(z, Z)
		ATTOMAPK__(KP_Add, KeypadPlus)
		ATTOMAPK__(KP_Subtract, KeypadMinus)
		ATTOMAPK__(F1, F1)
		ATTOMAPK__(F2, F2)
		ATTOMAPK__(F3, F3)
		ATTOMAPK__(F4, F4)
		ATTOMAPK__(F5, F5)
		ATTOMAPK__(F6, F6)
		ATTOMAPK__(F7, F7)
		ATTOMAPK__(F8, F8)
		ATTOMAPK__(F9, F9)
		ATTOMAPK__(F10, F10)
		ATTOMAPK__(F11, F11)
		ATTOMAPK__(F12, F12)
		ATTOMAPK__(Alt_L, LeftAlt)
		ATTOMAPK__(Control_L, LeftCtrl)
		ATTOMAPK__(Meta_L, LeftMeta)
		ATTOMAPK__(Super_L, LeftSuper)
		ATTOMAPK__(Shift_L, LeftShift)
		ATTOMAPK__(Alt_R, RightAlt)
		ATTOMAPK__(Control_R, RightCtrl)
		ATTOMAPK__(Meta_R, RightMeta)
		ATTOMAPK__(Super_R, RightSuper)
		ATTOMAPK__(Shift_R, RightShift)
		ATTOMAPK__(Caps_Lock, Capslock);
#undef ATTOMAPK_
	default: return;
	}

	if (a__app_state.keys[key] == down)
		return;

	a__app_state.keys[key] = down;

	if (a__app_proctable.key)
		a__app_proctable.key(timestamp, key, down);
}